

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lauxlib.c
# Opt level: O2

void luaL_addvalue(luaL_Buffer *B)

{
  lua_State *L;
  size_t in_RAX;
  char *s;
  size_t l;
  
  L = B->L;
  l = in_RAX;
  s = lua_tolstring(L,-1,&l);
  if (B->b != B->initb) {
    lua_rotate(L,-2,1);
  }
  luaL_addlstring(B,s,l);
  lua_rotate(L,B->b == B->initb | 0xfffffffe,-1);
  lua_settop(L,-2);
  return;
}

Assistant:

LUALIB_API void luaL_addvalue (luaL_Buffer *B) {
  lua_State *L = B->L;
  size_t l;
  const char *s = lua_tolstring(L, -1, &l);
  if (buffonstack(B))
    lua_insert(L, -2);  /* put value below buffer */
  luaL_addlstring(B, s, l);
  lua_remove(L, (buffonstack(B)) ? -2 : -1);  /* remove value */
}